

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaB_print(lua_State *L)

{
  uint uVar1;
  size_t in_RAX;
  char *__ptr;
  int unaff_EBP;
  uint idx;
  bool bVar2;
  size_t l;
  size_t local_38;
  
  local_38 = in_RAX;
  uVar1 = lua_gettop(L);
  lua_getglobal(L,"tostring");
  if (0 < (int)uVar1) {
    idx = 1;
    do {
      lua_pushvalue(L,-1);
      lua_pushvalue(L,idx);
      lua_callk(L,1,1,0,(lua_KFunction)0x0);
      __ptr = lua_tolstring(L,-1,&local_38);
      if (__ptr == (char *)0x0) {
        unaff_EBP = luaL_error(L,"\'tostring\' must return a string to \'print\'");
      }
      else {
        if (1 < idx) {
          fputc(9,_stdout);
        }
        fwrite(__ptr,1,local_38,_stdout);
        lua_settop(L,-2);
      }
      if (__ptr == (char *)0x0) {
        return unaff_EBP;
      }
      bVar2 = idx != uVar1;
      idx = idx + 1;
    } while (bVar2);
  }
  fputc(10,_stdout);
  fflush(_stdout);
  return 0;
}

Assistant:

static int luaB_print (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  lua_getglobal(L, "tostring");
  for (i=1; i<=n; i++) {
    const char *s;
    size_t l;
    lua_pushvalue(L, -1);  /* function to be called */
    lua_pushvalue(L, i);   /* value to print */
    lua_call(L, 1, 1);
    s = lua_tolstring(L, -1, &l);  /* get result */
    if (s == NULL)
      return luaL_error(L, "'tostring' must return a string to 'print'");
    if (i>1) lua_writestring("\t", 1);
    lua_writestring(s, l);
    lua_pop(L, 1);  /* pop result */
  }
  lua_writeline();
  return 0;
}